

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O1

void __thiscall
CoinSelection_SelectCoins_Error_CoinSelections_Simple_to_multiple_asset_utxo_Test::TestBody
          (CoinSelection_SelectCoins_Error_CoinSelections_Simple_to_multiple_asset_utxo_Test *this)

{
  bool bVar1;
  void *pvVar2;
  char *pcVar3;
  CoinSelectionOption *in_R9;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  Amount AVar5;
  bool use_bnb;
  AssertionResult gtest_ar_;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_e0;
  AssertHelper local_c8;
  AssertionResult gtest_ar;
  undefined1 local_b0 [40];
  undefined **local_88;
  pointer local_80;
  Amount local_58;
  Amount local_48;
  Amount fee;
  Amount select_value;
  
  AVar5 = cfd::core::Amount::CreateBySatoshiAmount(0x25402d4);
  local_48.amount_ = AVar5.amount_;
  local_48.ignore_check_ = AVar5.ignore_check_;
  cfd::core::Amount::Amount(&select_value);
  cfd::core::Amount::Amount(&fee);
  AVar5 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_58.amount_ = AVar5.amount_;
  local_58.ignore_check_ = AVar5.ignore_check_;
  use_bnb = false;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    GetElementsUtxoList();
    GetBitcoinOption();
    in_R9 = (CoinSelectionOption *)&gtest_ar;
    cfd::CoinSelection::SelectCoins
              ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&gtest_ar_,&exp_selection,&local_48,
               &local_e0,&exp_filter,in_R9,&local_58,&select_value,&fee,&use_bnb);
    sVar4 = gtest_ar_.message_;
    pvVar2 = (void *)gtest_ar_._0_8_;
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_88 = &PTR__ConfidentialAssetId_00735710;
    if (local_80 != (pointer)0x0) {
      operator_delete(local_80);
    }
    if (local_e0.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e0.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    sVar4.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pvVar2 = (void *)0x0;
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
             ,0x611,
             "Expected: ret = exp_selection.SelectCoins( target_amount, GetElementsUtxoList(), exp_filter, GetBitcoinOption(), tx_fee, &select_value, &fee, &use_bnb) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
  if (gtest_ar._0_8_ != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (gtest_ar._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
  }
  gtest_ar_._0_8_ = ((long)sVar4.ptr_ - (long)pvVar2 >> 3) * -0x7b425ed097b425ed;
  local_e0.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)((ulong)local_e0.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"ret.size()","0",(unsigned_long *)&gtest_ar_,(int *)&local_e0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x613,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_._0_8_ = cfd::core::Amount::GetSatoshiValue(&select_value);
  local_e0.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)((ulong)local_e0.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>.
                               _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"select_value.GetSatoshiValue()","0",(long *)&gtest_ar_,
             (int *)&local_e0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x614,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_._0_8_ = cfd::core::Amount::GetSatoshiValue(&fee);
  local_e0.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)((ulong)local_e0.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>.
                               _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"fee.GetSatoshiValue()","0",(long *)&gtest_ar_,(int *)&local_e0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x615,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,use_bnb) ^ 1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (use_bnb != false) {
    testing::Message::Message((Message *)&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"use_bnb","true",
               "false",&in_R9->use_bnb_);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x616,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((undefined1 *)gtest_ar._0_8_ != local_b0) {
      operator_delete((void *)gtest_ar._0_8_);
    }
    if (local_e0.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_e0.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)((local_e0.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                      super__Vector_impl_data._M_start)->block_height + 8))();
      }
      local_e0.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2);
  }
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Error_CoinSelections_Simple_to_multiple_asset_utxo)
{
  Amount target_amount = Amount::CreateBySatoshiAmount(39060180);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;
  std::vector<Utxo> ret;
  EXPECT_THROW(ret = exp_selection.SelectCoins(
      target_amount, GetElementsUtxoList(), exp_filter, GetBitcoinOption(),
      tx_fee, &select_value, &fee, &use_bnb), CfdException);

  EXPECT_EQ(ret.size(), 0);
  EXPECT_EQ(select_value.GetSatoshiValue(), 0);
  EXPECT_EQ(fee.GetSatoshiValue(), 0);
  EXPECT_FALSE(use_bnb);
}